

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O1

REF_STATUS ref_adapt_create(REF_ADAPT *ref_adapt_ptr)

{
  REF_STATUS RVar1;
  REF_ADAPT pRVar2;
  
  pRVar2 = (REF_ADAPT)malloc(0x88);
  *ref_adapt_ptr = pRVar2;
  if (pRVar2 == (REF_ADAPT)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x2e,
           "ref_adapt_create","malloc *ref_adapt_ptr of REF_ADAPT_STRUCT NULL");
    RVar1 = 2;
  }
  else {
    pRVar2->split_ratio_growth = 0;
    pRVar2->split_ratio = 1.4142135623730951;
    pRVar2->split_quality_absolute = 0.001;
    pRVar2->split_quality_relative = 0.1;
    pRVar2->collapse_ratio = 0.7071067811865475;
    pRVar2->collapse_quality_absolute = 0.001;
    pRVar2->smooth_min_quality = 0.001;
    pRVar2->smooth_pliant_alpha = 0.2;
    pRVar2->swap_max_degree = 10000;
    pRVar2->swap_min_quality = 0.5;
    pRVar2->post_min_normdev = 0.0;
    pRVar2->post_min_ratio = 0.001;
    pRVar2->post_max_ratio = 3.0;
    pRVar2->last_min_ratio = 0.0005;
    pRVar2->last_max_ratio = 6.0;
    pRVar2->unlock_tet = 0;
    pRVar2->timing_level = 0;
    pRVar2->watch_param = 0;
    pRVar2->watch_topo = 0;
    RVar1 = 0;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_adapt_create(REF_ADAPT *ref_adapt_ptr) {
  REF_ADAPT ref_adapt;

  ref_malloc(*ref_adapt_ptr, 1, REF_ADAPT_STRUCT);

  ref_adapt = *ref_adapt_ptr;

  ref_adapt->split_ratio_growth = REF_FALSE;
  ref_adapt->split_ratio = sqrt(2.0);
  ref_adapt->split_quality_absolute = 1.0e-3;
  ref_adapt->split_quality_relative = 0.1;

  ref_adapt->collapse_ratio = 1.0 / sqrt(2.0);
  ref_adapt->collapse_quality_absolute = 1.0e-3;

  ref_adapt->smooth_min_quality = 1.0e-3;
  ref_adapt->smooth_pliant_alpha = 0.2;

  ref_adapt->swap_max_degree = 10000;
  ref_adapt->swap_min_quality = 0.5;

  ref_adapt->post_min_normdev = 0.0;
  ref_adapt->post_min_ratio = 1.0e-3;
  ref_adapt->post_max_ratio = 3.0;

  ref_adapt->last_min_ratio = 0.5e-3;
  ref_adapt->last_max_ratio = 6.0;

  ref_adapt->unlock_tet = REF_FALSE;

  ref_adapt->timing_level = 0;
  ref_adapt->watch_param = REF_FALSE;
  ref_adapt->watch_topo = REF_FALSE;

  return REF_SUCCESS;
}